

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O0

long (anonymous_namespace)::RiemannR_inverse_overflow_check<long_double,long>(long x)

{
  long lVar1;
  longdouble in_ST0;
  longdouble in_stack_00000000;
  longdouble res;
  undefined8 local_8;
  
  anon_unknown.dwarf_1ec81::RiemannR_inverse<long_double>(in_stack_00000000);
  lVar1 = anon_unknown.dwarf_1ec81::pstd::numeric_limits<long>::max();
  if (in_ST0 <= (longdouble)lVar1) {
    local_8 = (long)ROUND(in_ST0);
  }
  else {
    local_8 = anon_unknown.dwarf_1ec81::pstd::numeric_limits<long>::max();
  }
  return local_8;
}

Assistant:

T RiemannR_inverse_overflow_check(T x)
{
  FLOAT res = RiemannR_inverse((FLOAT) x);

  // Prevent integer overflow
  if (res > (FLOAT) pstd::numeric_limits<T>::max())
    return pstd::numeric_limits<T>::max();
  else
    return (T) res;
}